

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O1

void highsLogUser(HighsLogOptions *log_options_,HighsLogType type,char *format,...)

{
  void **ppvVar1;
  char in_AL;
  int iVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  HighsLogType HVar4;
  ulong uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argptr;
  HighsCallbackDataOut data_out;
  array<char,_1024UL> msgbuffer;
  undefined8 local_5b8;
  void **local_5b0;
  undefined1 *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [24];
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_538;
  undefined8 local_528;
  undefined8 local_518;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  HighsCallbackDataOut local_4c8;
  char local_430 [1024];
  
  if (in_AL != '\0') {
    local_548 = in_XMM0_Qa;
    local_538 = in_XMM1_Qa;
    local_528 = in_XMM2_Qa;
    local_518 = in_XMM3_Qa;
    local_508 = in_XMM4_Qa;
    local_4f8 = in_XMM5_Qa;
    local_4e8 = in_XMM6_Qa;
    local_4d8 = in_XMM7_Qa;
  }
  if ((*log_options_->output_flag == true) &&
     ((log_options_->log_stream != (FILE *)0x0 || (*log_options_->log_to_console == true)))) {
    HVar4 = type & ~kInfo;
    local_5a8 = local_578;
    ppvVar1 = &argptr[0].overflow_arg_area;
    local_5b8 = 0x3000000018;
    local_5b0 = ppvVar1;
    local_560 = in_RCX;
    local_558 = in_R8;
    local_550 = in_R9;
    if ((log_options_->user_log_callback == (_func_void_HighsLogType_char_ptr_void_ptr *)0x0) &&
       (((log_options_->user_callback).super__Function_base._M_manager == (_Manager_type)0x0 ||
        (log_options_->user_callback_active == false)))) {
      if ((FILE *)log_options_->log_stream != (FILE *)0x0) {
        if (HVar4 == kWarning) {
          fprintf((FILE *)log_options_->log_stream,"%-9s",HighsLogTypeTag[type]);
        }
        vfprintf((FILE *)log_options_->log_stream,format,&local_5b8);
        fflush((FILE *)log_options_->log_stream);
      }
      local_5a8 = local_578;
      local_5b8 = 0x3000000018;
      if ((*log_options_->log_to_console == true) && ((FILE *)log_options_->log_stream != _stdout))
      {
        local_5b0 = ppvVar1;
        if (HVar4 == kWarning) {
          fprintf(_stdout,"%-9s",HighsLogTypeTag[type]);
        }
        vfprintf(_stdout,format,&local_5b8);
        fflush(_stdout);
      }
    }
    else {
      uVar5 = 0;
      memset(local_430,0,0x400);
      if (HVar4 == kWarning) {
        iVar2 = snprintf(local_430,0x400,"%-9s",HighsLogTypeTag[type]);
        uVar5 = (ulong)iVar2;
      }
      if (uVar5 < 0x400) {
        vsnprintf(local_430 + uVar5,0x400 - uVar5,format,&local_5b8);
      }
      if (log_options_->user_log_callback != (_func_void_HighsLogType_char_ptr_void_ptr *)0x0) {
        (*log_options_->user_log_callback)(type,local_430,log_options_->user_log_callback_data);
      }
      if (log_options_->user_callback_active == true) {
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        local_4c8.log_type = type;
        sVar3 = strlen(local_430);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_598,local_430,local_430 + sVar3);
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::operator()(&log_options_->user_callback,0,&local_598,&local_4c8,
                     (anon_struct_16_2_bb6a87e9 *)0x0,log_options_->user_callback_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p);
        }
      }
    }
  }
  return;
}

Assistant:

void highsLogUser(const HighsLogOptions& log_options_, const HighsLogType type,
                  const char* format, ...) {
  if (!*log_options_.output_flag ||
      (log_options_.log_stream == NULL && !*log_options_.log_to_console))
    return;
  // highsLogUser should not be passed HighsLogType::kDetailed or
  // HighsLogType::kVerbose
  assert(type != HighsLogType::kDetailed);
  assert(type != HighsLogType::kVerbose);
  const bool prefix =
      type == HighsLogType::kWarning || type == HighsLogType::kError;
  va_list argptr;
  va_start(argptr, format);
  const bool flush_streams = true;
  const bool use_log_callback =
      log_options_.user_log_callback ||
      (log_options_.user_callback && log_options_.user_callback_active);

  if (!use_log_callback) {
    // Write to log file stream unless it is NULL
    if (log_options_.log_stream) {
      if (prefix)
        fprintf(log_options_.log_stream, "%-9s", HighsLogTypeTag[(int)type]);
      vfprintf(log_options_.log_stream, format, argptr);
      if (flush_streams) fflush(log_options_.log_stream);
      va_end(argptr);
      va_start(argptr, format);
    }
    // Write to stdout unless log file stream is stdout
    if (*log_options_.log_to_console && log_options_.log_stream != stdout) {
      if (prefix) fprintf(stdout, "%-9s", HighsLogTypeTag[(int)type]);
      vfprintf(stdout, format, argptr);
      if (flush_streams) fflush(stdout);
    }
  } else {
    size_t len = 0;
    std::array<char, kIoBufferSize> msgbuffer = {};
    if (prefix) {
      int l = snprintf(msgbuffer.data(), msgbuffer.size(), "%-9s",
                       HighsLogTypeTag[(int)type]);
      // assert that there are no encoding errors
      assert(l >= 0);
      len = static_cast<size_t>(l);
    }
    if (len < msgbuffer.size()) {
      int l = vsnprintf(msgbuffer.data() + len, msgbuffer.size() - len, format,
                        argptr);
      // assert that there are no encoding errors
      assert(l >= 0);
      len += static_cast<size_t>(l);
    }
    if (log_options_.user_log_callback) {
      log_options_.user_log_callback(type, msgbuffer.data(),
                                     log_options_.user_log_callback_data);
    }
    if (log_options_.user_callback_active) {
      assert(log_options_.user_callback);
      HighsCallbackDataOut data_out;
      data_out.log_type = int(type);
      log_options_.user_callback(kCallbackLogging, msgbuffer.data(), &data_out,
                                 nullptr, log_options_.user_callback_data);
    }
  }
  va_end(argptr);
}